

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

void __thiscall player_t::TickPSprites(player_t *this)

{
  DObject *pDVar1;
  APlayerPawn *pAVar2;
  AWeapon *pAVar3;
  DBot *pDVar4;
  int iVar5;
  undefined8 in_RAX;
  DPSprite *this_00;
  undefined4 extraout_var;
  PClass *pPVar7;
  undefined4 extraout_var_01;
  DPSprite *pDVar8;
  APlayerPawn *pAVar9;
  AWeapon *pAVar10;
  long lVar11;
  anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1 *paVar12;
  AActor *pAVar13;
  bool bVar14;
  undefined8 uStack_38;
  PClass *pPVar6;
  undefined4 extraout_var_00;
  
  pDVar8 = (this->psprites).field_0.p;
  uStack_38 = in_RAX;
  if (pDVar8 != (DPSprite *)0x0) {
    if (((pDVar8->super_DObject).ObjectFlags & 0x20) == 0) {
      do {
        this_00 = pDVar8;
        pPVar7 = AInventory::RegistrationInfo.MyClass;
        pDVar1 = (this_00->Caller).field_0.o;
        if (pDVar1 == (DObject *)0x0) {
LAB_00558dad:
          (*(this_00->super_DObject)._vptr_DObject[4])(this_00);
        }
        else {
          if ((pDVar1->ObjectFlags & 0x20) != 0) {
            (this_00->Caller).field_0.p = (AActor *)0x0;
            goto LAB_00558dad;
          }
          pPVar6 = pDVar1->Class;
          if (pPVar6 == (PClass *)0x0) {
            iVar5 = (**pDVar1->_vptr_DObject)(pDVar1);
            pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
            pDVar1->Class = pPVar6;
          }
          bVar14 = pPVar6 != (PClass *)0x0;
          if (pPVar6 != pPVar7 && bVar14) {
            do {
              pPVar6 = pPVar6->ParentClass;
              bVar14 = pPVar6 != (PClass *)0x0;
              if (pPVar6 == pPVar7) break;
            } while (pPVar6 != (PClass *)0x0);
          }
          pAVar13 = (this_00->Caller).field_0.p;
          if (bVar14) {
            if (pAVar13 == (AActor *)0x0) {
LAB_00558cdc:
              pAVar13 = (AActor *)0x0;
            }
            else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
              (this_00->Caller).field_0.p = (AActor *)0x0;
              goto LAB_00558cdc;
            }
            pAVar2 = this_00->Owner->mo;
            pAVar9 = (APlayerPawn *)pAVar13[1].super_DThinker.super_DObject._vptr_DObject;
            if (pAVar9 == (APlayerPawn *)0x0) {
LAB_00558d03:
              pAVar9 = (APlayerPawn *)0x0;
            }
            else if (((pAVar9->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0)
            {
              pAVar13[1].super_DThinker.super_DObject._vptr_DObject = (_func_int **)0x0;
              goto LAB_00558d03;
            }
            if (pAVar9 != pAVar2) goto LAB_00558dad;
            pAVar13 = (this_00->Caller).field_0.p;
          }
          if (pAVar13 == (AActor *)0x0) {
LAB_00558d26:
            pAVar13 = (AActor *)0x0;
          }
          else if (((pAVar13->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
            (this_00->Caller).field_0.p = (AActor *)0x0;
            goto LAB_00558d26;
          }
          pPVar6 = AWeapon::RegistrationInfo.MyClass;
          pPVar7 = (pAVar13->super_DThinker).super_DObject.Class;
          if (pPVar7 == (PClass *)0x0) {
            iVar5 = (**(pAVar13->super_DThinker).super_DObject._vptr_DObject)(pAVar13);
            pPVar7 = (PClass *)CONCAT44(extraout_var_00,iVar5);
            (pAVar13->super_DThinker).super_DObject.Class = pPVar7;
          }
          bVar14 = pPVar7 != (PClass *)0x0;
          if (pPVar7 != pPVar6 && bVar14) {
            do {
              pPVar7 = pPVar7->ParentClass;
              bVar14 = pPVar7 != (PClass *)0x0;
              if (pPVar7 == pPVar6) break;
            } while (pPVar7 != (PClass *)0x0);
          }
          if (bVar14) {
            pAVar10 = (AWeapon *)(this_00->Caller).field_0.p;
            pAVar3 = this_00->Owner->ReadyWeapon;
            if (pAVar10 == (AWeapon *)0x0) {
LAB_00558d94:
              pAVar10 = (AWeapon *)0x0;
            }
            else if (((pAVar10->super_AInventory).super_AActor.super_DThinker.super_DObject.
                      ObjectFlags & 0x20) != 0) {
              (this_00->Caller).field_0.p = (AActor *)0x0;
              goto LAB_00558d94;
            }
            if (pAVar10 != pAVar3) goto LAB_00558dad;
          }
          DPSprite::Tick(this_00);
        }
        pDVar8 = (this_00->Next).field_0.p;
        if (pDVar8 == (DPSprite *)0x0) goto LAB_00558ddd;
      } while (((pDVar8->super_DObject).ObjectFlags & 0x20) == 0);
      paVar12 = &(this_00->Next).field_0;
    }
    else {
      paVar12 = &(this->psprites).field_0;
    }
    paVar12->p = (DPSprite *)0x0;
  }
LAB_00558ddd:
  pAVar10 = this->ReadyWeapon;
  if (this->health < 1) {
    if (pAVar10 == (AWeapon *)0x0) {
      return;
    }
    if (((pAVar10->super_AInventory).field_0x4de & 4) != 0) {
      return;
    }
  }
  else if (pAVar10 == (AWeapon *)0x0) {
    if (this->PendingWeapon == (AWeapon *)0xffffffffffffffff) {
      return;
    }
    P_BringUpWeapon(this);
    return;
  }
  P_CheckWeaponSwitch(this);
  if ((this->WeaponState & 5) != 0) {
    P_CheckWeaponFire(this);
  }
  pDVar4 = (this->Bot).field_0.p;
  if (pDVar4 != (DBot *)0x0) {
    if (((pDVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_00558e6f;
    (this->Bot).field_0.p = (DBot *)0x0;
  }
  if (bot_observer.Value != false) {
    return;
  }
LAB_00558e6f:
  pAVar10 = this->ReadyWeapon;
  if (pAVar10 != (AWeapon *)0x0) {
    lVar11 = 0xc;
    do {
      if (((*(uint *)(&UNK_00769058 + lVar11) & (uint)this->WeaponState) != 0) &&
         (((this->cmd).ucmd.buttons & *(uint *)(&UNK_0076905c + lVar11)) != 0)) {
        uStack_38 = CONCAT44(*(undefined4 *)((long)&ButtonChecks[0].ReadyFlag + lVar11),
                             (undefined4)uStack_38);
        iVar5 = (*(pAVar10->super_AInventory).super_AActor.super_DThinker.super_DObject.
                  _vptr_DObject[0x49])(pAVar10,(long)&uStack_38 + 4);
        if ((FState *)CONCAT44(extraout_var_01,iVar5) != (FState *)0x0) {
          pDVar8 = GetPSprite(this,PSP_WEAPON);
          DPSprite::SetState(pDVar8,(FState *)CONCAT44(extraout_var_01,iVar5),false);
          return;
        }
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x6c);
  }
  return;
}

Assistant:

void player_t::TickPSprites()
{
	DPSprite *pspr = psprites;
	while (pspr)
	{
		// Destroy the psprite if it's from a weapon that isn't currently selected by the player
		// or if it's from an inventory item that the player no longer owns. 
		if ((pspr->Caller == nullptr ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AInventory)) && barrier_cast<AInventory *>(pspr->Caller)->Owner != pspr->Owner->mo) ||
			(pspr->Caller->IsKindOf(RUNTIME_CLASS(AWeapon)) && pspr->Caller != pspr->Owner->ReadyWeapon)))
		{
			pspr->Destroy();
		}
		else
		{
			pspr->Tick();
		}

		pspr = pspr->Next;
	}

	if ((health > 0) || (ReadyWeapon != nullptr && !(ReadyWeapon->WeaponFlags & WIF_NODEATHINPUT)))
	{
		if (ReadyWeapon == nullptr)
		{
			if (PendingWeapon != WP_NOCHANGE)
				P_BringUpWeapon(this);
		}
		else
		{
			P_CheckWeaponSwitch(this);
			if (WeaponState & (WF_WEAPONREADY | WF_WEAPONREADYALT))
			{
				P_CheckWeaponFire(this);
			}
			// Check custom buttons
			P_CheckWeaponButtons(this);
		}
	}
}